

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O2

void xmlXIncludeErrMemory(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node,char *extra)

{
  if (ctxt != (xmlXIncludeCtxtPtr)0x0) {
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt,node,0xb,2,
                  XML_ERR_ERROR,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,
                  "Memory allocation failed : %s\n",extra);
  return;
}

Assistant:

static void
xmlXIncludeErrMemory(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node,
                     const char *extra)
{
    if (ctxt != NULL)
	ctxt->nbErrors++;
    __xmlRaiseError(NULL, NULL, NULL, ctxt, node, XML_FROM_XINCLUDE,
                    XML_ERR_NO_MEMORY, XML_ERR_ERROR, NULL, 0,
		    extra, NULL, NULL, 0, 0,
		    "Memory allocation failed : %s\n", extra);
}